

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dml.cpp
# Opt level: O2

void __thiscall dml::listRecords(dml *this,string *typeName,ostream *stream)

{
  byte bVar1;
  ushort uVar2;
  iterator iVar3;
  undefined8 extraout_RAX;
  ostream *poVar4;
  pointer prVar5;
  ushort uVar6;
  void *__buf;
  uint32_t __val;
  uint32_t uVar7;
  int i;
  void *__buf_00;
  ulong uVar8;
  allocator local_36d;
  uint local_36c;
  vector<record,_std::allocator<record>_> records;
  vector<record,_std::allocator<record>_> pageRecords;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  file file;
  string local_2c0;
  string local_2a0;
  string local_280;
  page page;
  fstream currFile;
  
  iVar3 = SystemCatalog::getType(this->systemCatalog,typeName);
  if ((_Rb_tree_header *)iVar3._M_node !=
      &(this->systemCatalog->types)._M_t._M_impl.super__Rb_tree_header) {
    std::vector<record,_std::allocator<record>_>::vector(&records,0,(allocator_type *)&currFile);
    bVar1 = (char)iVar3._M_node[2]._M_color << 2;
    local_36c = (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),bVar1) + 1;
    prVar5 = (pointer)(ulong)local_36c;
    uVar2 = (ushort)(0x7fb / (bVar1 | 2));
    uVar6 = 0xff;
    if (uVar2 < 0xff) {
      uVar6 = uVar2;
    }
    local_36c = local_36c & 0xff;
    __val = 1;
    do {
      std::__cxx11::string::string((string *)&local_318,"data/",&local_36d);
      std::__cxx11::string::string((string *)&local_2a0,(string *)typeName);
      truncateName(&local_280,&local_2a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&page,
                     &local_318,&local_280);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &pageRecords,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&page,"_")
      ;
      std::__cxx11::to_string(&local_2c0,__val);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &pageRecords,&local_2c0);
      std::fstream::fstream(&currFile,(string *)&file,_S_in|_S_bin);
      std::__cxx11::string::~string((string *)&file);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&pageRecords);
      std::__cxx11::string::~string((string *)&page);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_318);
      ::file::file(&file);
      ::file::read(&file,(int)&currFile,__buf,(size_t)prVar5);
      __buf_00 = (void *)0x16;
      for (uVar7 = file.numRecords; __val = file.nextFile, 0 < (int)uVar7; uVar7 = uVar7 - 1) {
        uVar8 = (ulong)(byte)uVar6;
        ::page::page(&page,'\0',local_36c,(byte)uVar6);
        ::page::read(&page,(int)&currFile,__buf_00,uVar8);
        ::page::getRecords(&pageRecords,&page,&currFile,(int)__buf_00,
                           (char)iVar3._M_node[2]._M_color);
        prVar5 = pageRecords.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        std::vector<record,std::allocator<record>>::
        insert<__gnu_cxx::__normal_iterator<record*,std::vector<record,std::allocator<record>>>,void>
                  ((vector<record,std::allocator<record>> *)&records,
                   (const_iterator)
                   records.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<record_*,_std::vector<record,_std::allocator<record>_>_>)
                   pageRecords.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (__normal_iterator<record_*,_std::vector<record,_std::allocator<record>_>_>)
                   pageRecords.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        __buf_00 = (void *)(ulong)((int)__buf_00 + 0x800);
        std::vector<record,_std::allocator<record>_>::~vector(&pageRecords);
        ::page::~page(&page);
      }
      std::__cxx11::string::~string((string *)&file.typeName);
      std::fstream::~fstream(&currFile);
    } while (__val != 0);
    std::
    __sort<__gnu_cxx::__normal_iterator<record*,std::vector<record,std::allocator<record>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (records.super__Vector_base<record,_std::allocator<record>_>._M_impl.
               super__Vector_impl_data._M_start,
               records.super__Vector_base<record,_std::allocator<record>_>._M_impl.
               super__Vector_impl_data._M_finish);
    for (prVar5 = records.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                  super__Vector_impl_data._M_start;
        prVar5 != records.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                  super__Vector_impl_data._M_finish; prVar5 = prVar5 + 1) {
      for (uVar8 = 0; uVar8 < prVar5->numFields; uVar8 = uVar8 + 1) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)stream,prVar5->fields[uVar8]);
        std::operator<<(poVar4," ");
      }
      std::endl<char,std::char_traits<char>>(stream);
    }
    std::vector<record,_std::allocator<record>_>::~vector(&records);
  }
  return;
}

Assistant:

void dml::listRecords(string typeName, ostream &stream) {
    auto type = systemCatalog->getType(typeName);

    if(type == systemCatalog->types.end()) { return; }

    auto records = vector<record>(0);

    int currFileLink = 1;

    auto recordSize = (uint8_t) (RECORD_ID + type->numFields * FIELD);

    auto slotSize = (uint8_t) min((PAGE - PAGE_ID - NUM_RECORDS) / (recordSize+ 1), 255);

    do {
        fstream currFile(ROOT + truncateName(typeName) + INFIX + to_string(currFileLink), INBIN);

        file file;
        file.read(currFile);

        int offset = IS_FULL + TYPE_NAME + NUM_PAGES + NUM_RECORDS + LINK_TO_FILE + LINK_TO_FILE;

        for (int i = file.numRecords; i > 0; --i) {
            page page(0, recordSize, slotSize);

            page.read(currFile, offset);

            vector<record> pageRecords = page.getRecords(currFile, offset, type->numFields);

            records.insert(records.end(), pageRecords.begin(), pageRecords.end());

            offset += PAGE;
        }

        currFileLink = file.nextFile;
    } while(currFileLink != 0);

    sort(records.begin(), records.end());

    for (const auto &record: records) {

        for (int i = 0; i < record.numFields; ++i) {
            stream << record.fields[i] << " ";
        }

        stream << endl;
    }
}